

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
* __thiscall
testing::internal::
TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::WillRepeatedly(TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *this,Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *action)

{
  Clause CVar1;
  allocator local_39;
  string local_38;
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  if (CVar1 == kWillRepeatedly) {
    std::__cxx11::string::string
              ((string *)&local_38,
               ".WillRepeatedly() cannot appear more than once in an EXPECT_CALL().",&local_39);
    ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,false,&local_38);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_38,".WillRepeatedly() cannot appear after .RetiresOnSaturation().",
               &local_39);
    ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,(int)CVar1 < 6,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_ExpectationBase).last_clause_ = kWillRepeatedly;
  (this->super_ExpectationBase).repeated_action_specified_ = true;
  std::
  function<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&(this->repeated_action_).fun_,&action->fun_);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    AtLeast((testing *)&local_38,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    std::__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ExpectationBase).cardinality_,
               (__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  }
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  return this;
}

Assistant:

TypedExpectation& WillRepeatedly(const Action<F>& action) {
    if (last_clause_ == kWillRepeatedly) {
      ExpectSpecProperty(false,
                         ".WillRepeatedly() cannot appear "
                         "more than once in an EXPECT_CALL().");
    } else {
      ExpectSpecProperty(last_clause_ < kWillRepeatedly,
                         ".WillRepeatedly() cannot appear "
                         "after .RetiresOnSaturation().");
    }
    last_clause_ = kWillRepeatedly;
    repeated_action_specified_ = true;

    repeated_action_ = action;
    if (!cardinality_specified()) {
      set_cardinality(AtLeast(static_cast<int>(untyped_actions_.size())));
    }

    // Now that no more action clauses can be specified, we check
    // whether their count makes sense.
    CheckActionCountIfNotDone();
    return *this;
  }